

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.h
# Opt level: O2

int __thiscall soplex::DataSet<int>::number(DataSet<int> *this,DataKey *k)

{
  int iVar1;
  SPxException *this_00;
  allocator local_39;
  string local_38;
  
  iVar1 = k->idx;
  if ((-1 < (long)iVar1) && (iVar1 < this->thesize)) {
    return this->theitem[iVar1].info;
  }
  this_00 = (SPxException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"Invalid index",&local_39);
  SPxException::SPxException(this_00,&local_38);
  __cxa_throw(this_00,&SPxException::typeinfo,SPxException::~SPxException);
}

Assistant:

int number(const DataKey& k) const
   {
      if(k.idx < 0 || k.idx >= size())
         throw SPxException("Invalid index");

      return theitem[k.idx].info;
   }